

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void terminal_bind_arrow(EditLine *el)

{
  keymacro_value_t *val;
  keymacro_value_t *val_00;
  keymacro_value_t *pkVar1;
  keymacro_value_t *pkVar2;
  keymacro_value_t *val_01;
  keymacro_value_t *val_02;
  funckey_t *pfVar3;
  byte *pbVar4;
  el_action_t eVar5;
  long lVar6;
  ulong uVar7;
  el_action_t *map;
  size_t __n;
  funckey_t *arrow;
  wchar_t wt_str [8];
  wchar_t local_68 [8];
  keymacro_value_t *local_48;
  keymacro_value_t *local_40;
  long local_38;
  
  if (((el->el_terminal).t_buf != (char *)0x0) &&
     (map = (el->el_map).key, map != (el_action_t *)0x0)) {
    pfVar3 = (el->el_terminal).t_fkey;
    lVar6 = 0x408;
    if ((el->el_map).type == L'\x01') {
      map = (el->el_map).alt;
      lVar6 = 0x410;
    }
    local_38 = *(long *)((long)&el->el_prog + lVar6);
    val = &pfVar3[1].fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strA,val,pfVar3[1].type);
    val_00 = &pfVar3->fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strB,val_00,pfVar3->type);
    pkVar1 = &pfVar3[3].fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strC,pkVar1,pfVar3[3].type);
    pkVar2 = &pfVar3[2].fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strD,pkVar2,pfVar3[2].type);
    val_01 = &pfVar3[4].fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strH,val_01,pfVar3[4].type);
    val_02 = &pfVar3[5].fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strF,val_02,pfVar3[5].type);
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOA,val,pfVar3[1].type);
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOB,val_00,pfVar3->type);
    local_40 = pkVar1;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOC,pkVar1,pfVar3[3].type);
    local_48 = pkVar2;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOD,pkVar2,pfVar3[2].type);
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOH,val_01,pfVar3[4].type);
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOF,val_02,pfVar3[5].type);
    if ((el->el_map).type == L'\x01') {
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strA + 4),val,pfVar3[1].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strB + 4),val_00,pfVar3->type);
      pkVar2 = local_40;
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strC + 4),local_40,pfVar3[3].type);
      pkVar1 = local_48;
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strD + 4),local_48,pfVar3[2].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strH + 4),val_01,pfVar3[4].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strF + 4),val_02,pfVar3[5].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOA + 4),val,pfVar3[1].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOB + 4),val_00,pfVar3->type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOC + 4),pkVar2,pfVar3[3].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOD + 4),pkVar1,pfVar3[2].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOH + 4),val_01,pfVar3[4].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOF + 4),val_02,pfVar3[5].type);
    }
    lVar6 = 0;
    do {
      pbVar4 = (byte *)(el->el_terminal).t_str[pfVar3[lVar6].key];
      if ((pbVar4 != (byte *)0x0) && (*pbVar4 != 0)) {
        __n = 0x20;
        uVar7 = 0;
        do {
          if (pbVar4[uVar7] == 0) {
            if (uVar7 < 8) {
              memset(local_68 + uVar7,0,__n);
            }
            break;
          }
          local_68[uVar7] = (int)(char)pbVar4[uVar7];
          uVar7 = uVar7 + 1;
          __n = __n - 4;
        } while (__n != 0);
        if (pfVar3[lVar6].type == L'\x02') {
          keymacro_clear(el,map,local_68);
        }
        else {
          uVar7 = (ulong)*pbVar4;
          if (pbVar4[1] == 0) {
            eVar5 = map[uVar7];
          }
          else {
            eVar5 = map[uVar7];
            if ((*(el_action_t *)(local_38 + uVar7) == eVar5) || (eVar5 == '\x19')) {
              keymacro_add(el,local_68,&pfVar3[lVar6].fun,pfVar3[lVar6].type);
              map[uVar7] = '\x19';
              goto LAB_0011107e;
            }
          }
          if (eVar5 == '\x1c') {
            keymacro_clear(el,map,local_68);
            if (pfVar3[lVar6].type == L'\0') {
              map[uVar7] = pfVar3[lVar6].fun.cmd;
            }
            else {
              keymacro_add(el,local_68,&pfVar3[lVar6].fun,pfVar3[lVar6].type);
            }
          }
        }
      }
LAB_0011107e:
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
  }
  return;
}

Assistant:

libedit_private void
terminal_bind_arrow(EditLine *el)
{
	el_action_t *map;
	const el_action_t *dmap;
	int i, j;
	char *p;
	funckey_t *arrow = el->el_terminal.t_fkey;

	/* Check if the components needed are initialized */
	if (el->el_terminal.t_buf == NULL || el->el_map.key == NULL)
		return;

	map = el->el_map.type == MAP_VI ? el->el_map.alt : el->el_map.key;
	dmap = el->el_map.type == MAP_VI ? el->el_map.vic : el->el_map.emacs;

	terminal_reset_arrow(el);

	for (i = 0; i < A_K_NKEYS; i++) {
		wchar_t wt_str[VISUAL_WIDTH_MAX];
		wchar_t *px;
		size_t n;

		p = el->el_terminal.t_str[arrow[i].key];
		if (!p || !*p)
			continue;
		for (n = 0; n < VISUAL_WIDTH_MAX && p[n]; ++n)
			wt_str[n] = p[n];
		while (n < VISUAL_WIDTH_MAX)
			wt_str[n++] = '\0';
		px = wt_str;
		j = (unsigned char) *p;
		/*
		 * Assign the arrow keys only if:
		 *
		 * 1. They are multi-character arrow keys and the user
		 *    has not re-assigned the leading character, or
		 *    has re-assigned the leading character to be
		 *	  ED_SEQUENCE_LEAD_IN
		 * 2. They are single arrow keys pointing to an
		 *    unassigned key.
		 */
		if (arrow[i].type == XK_NOD)
			keymacro_clear(el, map, px);
		else {
			if (p[1] && (dmap[j] == map[j] ||
				map[j] == ED_SEQUENCE_LEAD_IN)) {
				keymacro_add(el, px, &arrow[i].fun,
				    arrow[i].type);
				map[j] = ED_SEQUENCE_LEAD_IN;
			} else if (map[j] == ED_UNASSIGNED) {
				keymacro_clear(el, map, px);
				if (arrow[i].type == XK_CMD)
					map[j] = arrow[i].fun.cmd;
				else
					keymacro_add(el, px, &arrow[i].fun,
					    arrow[i].type);
			}
		}
	}
}